

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

void nn_sinproc_init(nn_sinproc *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_fsm_fn in_RCX;
  nn_fsm_fn in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t sz;
  int rcvbuf;
  nn_fsm *in_stack_ffffffffffffffc8;
  nn_pipebase *in_stack_ffffffffffffffd0;
  nn_msg *self_00;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init((nn_fsm *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX,
              in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 0x58) = 1;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  nn_pipebase_init(in_stack_ffffffffffffffd0,(nn_pipebase_vfptr *)in_stack_ffffffffffffffc8,
                   (nn_ep *)0x13b59c);
  self_00 = (nn_msg *)0x4;
  nn_ep_getopt((nn_ep *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               (int)in_RDX,in_RCX,
               (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (self_00 != (nn_msg *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvbuf)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
            ,0x4f);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_msgqueue_init((nn_msgqueue *)0x4,(size_t)in_stack_ffffffffffffffc8);
  nn_msg_init(self_00,(size_t)in_stack_ffffffffffffffc8);
  nn_fsm_event_init((nn_fsm_event *)0x13b65b);
  nn_fsm_event_init((nn_fsm_event *)0x13b66c);
  nn_fsm_event_init((nn_fsm_event *)0x13b67d);
  nn_fsm_event_init((nn_fsm_event *)0x13b68e);
  nn_list_item_init((nn_list_item *)(in_RDI + 0x280));
  return;
}

Assistant:

void nn_sinproc_init (struct nn_sinproc *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    int rcvbuf;
    size_t sz;

    nn_fsm_init (&self->fsm, nn_sinproc_handler, nn_sinproc_shutdown,
        src, self, owner);
    self->state = NN_SINPROC_STATE_IDLE;
    self->flags = 0;
    self->peer = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sinproc_pipebase_vfptr, ep);
    sz = sizeof (rcvbuf);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RCVBUF, &rcvbuf, &sz);
    nn_assert (sz == sizeof (rcvbuf));
    nn_msgqueue_init (&self->msgqueue, rcvbuf);
    nn_msg_init (&self->msg, 0);
    nn_fsm_event_init (&self->event_connect);
    nn_fsm_event_init (&self->event_sent);
    nn_fsm_event_init (&self->event_received);
    nn_fsm_event_init (&self->event_disconnect);
    nn_list_item_init (&self->item);
}